

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

const_iterator __thiscall QDirListing::begin(QDirListing *this)

{
  DirEntry this_00;
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  *pvVar1;
  vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
  *pvVar2;
  const_iterator cVar3;
  
  QDirListingPrivate::beginIterating(this->d);
  this_00.dirListPtr = this->d;
  QDirListingPrivate::advance(this_00.dirListPtr);
  pvVar1 = (vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
            *)&(this_00.dirListPtr)->nativeIterators;
  pvVar2 = (vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
            *)&(this_00.dirListPtr)->nativeIterators;
  if (((this_00.dirListPtr)->engine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl != (QAbstractFileEngine *)0x0
     ) {
    pvVar1 = &(this_00.dirListPtr)->fileEngineIterators;
    pvVar2 = &(this_00.dirListPtr)->fileEngineIterators;
  }
  cVar3.dirEntry.dirListPtr = (DirEntry)(DirEntry)(QDirListingPrivate *)0x0;
  if ((pvVar1->
      super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cVar3.dirEntry.dirListPtr = (DirEntry)(DirEntry)this_00.dirListPtr;
  }
  return (const_iterator)cVar3.dirEntry.dirListPtr;
}

Assistant:

QDirListing::const_iterator QDirListing::begin() const
{
    d->beginIterating();
    const_iterator it{d};
    ++it;
    return it;
}